

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall
S2Builder::BuildLayerEdges
          (S2Builder *this,
          vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
          *layer_edges,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *layer_input_edge_ids,IdSetLexicon *input_edge_id_set_lexicon)

{
  pointer piVar1;
  bool bVar2;
  pointer puVar3;
  GraphOptions *options;
  pointer puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  site_vertices;
  IdSetLexicon *in_stack_ffffffffffffff98;
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->snapping_needed_ == true) && ((this->options_).simplify_edge_chains_ == true)) {
    bVar2 = true;
    std::
    vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
    ::resize(&local_48,
             ((long)(this->sites_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->sites_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  }
  else {
    bVar2 = false;
  }
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::resize(layer_edges,
           (long)(this->layers_).
                 super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->layers_).
                 super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(layer_input_edge_ids,
           (long)(this->layers_).
                 super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->layers_).
                 super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  lVar6 = 0;
  uVar5 = 0;
  lVar7 = 0;
  while( true ) {
    puVar3 = (this->layers_).
             super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->layers_).
             super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar4 - (long)puVar3 >> 3) <= uVar5) break;
    piVar1 = (this->layer_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    options = (GraphOptions *)
              ((long)&((this->layer_options_).
                       super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>
                       ._M_impl.super__Vector_impl_data._M_start)->edge_type_ + lVar6);
    lVar6 = lVar6 + 0x14;
    AddSnappedEdges(this,piVar1[uVar5],piVar1[uVar5 + 1],options,
                    (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                    ((long)&(((layer_edges->
                              super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data + lVar7),
                    (vector<int,_std::allocator<int>_> *)
                    ((long)&(((layer_input_edge_ids->
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data + lVar7),in_stack_ffffffffffffff98,&local_48);
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 0x18;
  }
  if (bVar2) {
    SimplifyEdgeChains(this,&local_48,layer_edges,layer_input_edge_ids,input_edge_id_set_lexicon);
    puVar3 = (this->layers_).
             super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->layers_).
             super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar4 != puVar3) {
    lVar6 = 0;
    lVar7 = 0;
    uVar5 = 0;
    do {
      Graph::ProcessEdges((GraphOptions *)
                          ((long)&((this->layer_options_).
                                   super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->edge_type_ + lVar6),
                          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          ((long)&(((layer_edges->
                                    super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data + lVar7),
                          (vector<int,_std::allocator<int>_> *)
                          ((long)&(((layer_input_edge_ids->
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data + lVar7),input_edge_id_set_lexicon,
                          this->error_);
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x18;
      lVar6 = lVar6 + 0x14;
    } while (uVar5 < (ulong)((long)(this->layers_).
                                   super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->layers_).
                                   super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void S2Builder::BuildLayerEdges(
    vector<vector<Edge>>* layer_edges,
    vector<vector<InputEdgeIdSetId>>* layer_input_edge_ids,
    IdSetLexicon* input_edge_id_set_lexicon) {
  // Edge chains are simplified only when a non-zero snap radius is specified.
  // If so, we build a map from each site to the set of input vertices that
  // snapped to that site.
  vector<compact_array<InputVertexId>> site_vertices;
  bool simplify = snapping_needed_ && options_.simplify_edge_chains();
  if (simplify) site_vertices.resize(sites_.size());

  layer_edges->resize(layers_.size());
  layer_input_edge_ids->resize(layers_.size());
  for (int i = 0; i < layers_.size(); ++i) {
    AddSnappedEdges(layer_begins_[i], layer_begins_[i+1], layer_options_[i],
                    &(*layer_edges)[i], &(*layer_input_edge_ids)[i],
                    input_edge_id_set_lexicon, &site_vertices);
  }
  if (simplify) {
    SimplifyEdgeChains(site_vertices, layer_edges, layer_input_edge_ids,
                       input_edge_id_set_lexicon);
  }
  // We simplify edge chains before processing the per-layer GraphOptions
  // because simplification can create duplicate edges and/or sibling edge
  // pairs which may need to be removed.
  for (int i = 0; i < layers_.size(); ++i) {
    // The errors generated by ProcessEdges are really warnings, so we simply
    // record them and continue.
    Graph::ProcessEdges(&layer_options_[i], &(*layer_edges)[i],
                        &(*layer_input_edge_ids)[i],
                        input_edge_id_set_lexicon, error_);
  }
}